

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTPNInh::gen_code_mminh
          (CTPNInh *this,CTcSymFunc *func,int discard,CTcPrsNode *prop_expr,int prop_is_expr,
          int argc,int varargs,CTcNamedArgs *named_args)

{
  tc_symtype_t tVar1;
  CTcSymFunc *pCVar2;
  CTcPrsSymtab *this_00;
  CTcSymbol *this_01;
  uint in_EDX;
  CTcSymFunc *in_RSI;
  long in_RDI;
  uint in_R9D;
  bool bVar3;
  uint in_stack_00000008;
  undefined8 in_stack_00000010;
  CTcSymFunc *ifunc;
  CTcToken dtok;
  CTcToken btok;
  size_t rem;
  char *p;
  char *nm;
  CTcSymFunc *mmci;
  textchar_t *in_stack_ffffffffffffff38;
  CTcPrsSymtab *in_stack_ffffffffffffff40;
  CTcToken *in_stack_ffffffffffffff60;
  CTcToken *in_stack_ffffffffffffff68;
  CTcFormalTypeList *in_stack_ffffffffffffff70;
  CTcToken local_70;
  size_t local_48;
  char *local_40;
  char *local_38;
  CTcSymbol *local_30;
  uint local_28;
  uint local_14;
  CTcSymFunc *local_10;
  
  local_28 = in_R9D;
  local_14 = in_EDX;
  local_10 = in_RSI;
  while (pCVar2 = CTcSymFuncBase::get_mod_global(&local_10->super_CTcSymFuncBase),
        pCVar2 != (CTcSymFunc *)0x0) {
    local_10 = CTcSymFuncBase::get_mod_global(&local_10->super_CTcSymFuncBase);
  }
  if (*(long *)(in_RDI + 8) == 0) {
    (*(local_10->super_CTcSymFuncBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
      super_CVmHashEntry._vptr_CVmHashEntry[0x18])(local_10,0);
    CTcParser::get_global_symtab(G_prs);
    local_30 = CTcPrsSymtab::find(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0x27c682);
    if ((local_30 == (CTcSymbol *)0x0) ||
       (tVar1 = CTcSymbolBase::get_type(&local_30->super_CTcSymbolBase), tVar1 != TC_SYM_FUNC)) {
      CTcTokenizer::log_error(0x2d27,0x19,"_multiMethodCallInherited");
    }
    else {
      (*(local_30->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry
        [0x1b])(local_30,(ulong)local_14,(ulong)(local_28 + 1),(ulong)in_stack_00000008,
                in_stack_00000010);
    }
  }
  else {
    local_38 = CVmHashEntry::getstr((CVmHashEntry *)local_10);
    local_48 = CVmHashEntry::getlen((CVmHashEntry *)local_10);
    local_40 = local_38;
    while( true ) {
      bVar3 = false;
      if (local_48 != 0) {
        bVar3 = *local_40 != '*';
      }
      if (!bVar3) break;
      local_40 = local_40 + 1;
      local_48 = local_48 - 1;
    }
    CTcToken::CTcToken(&local_70);
    CTcToken::set_text(&local_70,local_38,(long)local_40 - (long)local_38);
    CTcToken::CTcToken((CTcToken *)&stack0xffffffffffffff68);
    CTcFormalTypeList::decorate_name
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    this_00 = CTcParser::get_global_symtab(G_prs);
    CTcToken::get_text((CTcToken *)&stack0xffffffffffffff68);
    CTcToken::get_text_len((CTcToken *)&stack0xffffffffffffff68);
    this_01 = CTcPrsSymtab::find(this_00,in_stack_ffffffffffffff38,0x27c81d);
    if ((this_01 == (CTcSymbol *)0x0) ||
       (tVar1 = CTcSymbolBase::get_type(&this_01->super_CTcSymbolBase), tVar1 != TC_SYM_FUNC)) {
      CTcTokenizer::log_error(0x2d28,(ulong)(uint)((int)local_40 - (int)local_38),local_38);
    }
    else {
      (*(this_01->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry._vptr_CVmHashEntry
        [0x1b])(this_01,(ulong)local_14,(ulong)local_28,(ulong)in_stack_00000008,in_stack_00000010);
    }
  }
  return;
}

Assistant:

void CTPNInh::gen_code_mminh(CTcSymFunc *func, int discard,
                             CTcPrsNode *prop_expr, int prop_is_expr,
                             int argc, int varargs,
                             CTcNamedArgs *named_args)
{
    /*
     *   If the function has an associated global symbol from a modification,
     *   use the global symbol instead.  The modified function doesn't have a
     *   real symbol, so we can't use it; but fortunately, the global symbol
     *   applies to all modified versions as well, since they all inherit
     *   from the same base function.  
     */
    while (func->get_mod_global() != 0)
        func = func->get_mod_global();

    /*
     *   There are two forms of inherited() for multi-methods.
     *   
     *   inherited<types>(args) - this form takes an explicit type list, to
     *   invoke a specific overridden version.
     *   
     *   inherited(args) - this form invokes the next inherited version,
     *   determined dynamically at run-time.  
     */
    if (typelist_ == 0)
    {
        /*
         *   It's the inherited(args) format.
         *   
         *   Call _multiMethodCallInherited(fromFunc, args).  We've already
         *   pushed the args list, so just add the source function argument
         *   (which is simply our defining function).  
         */
        func->gen_code(FALSE);

        /* look up _multiMethodCallInherited */
        CTcSymFunc *mmci = (CTcSymFunc *)G_prs->get_global_symtab()->find(
            "_multiMethodCallInherited", 25);

        if (mmci == 0 || mmci->get_type() != TC_SYM_FUNC)
        {
            /* undefined or incorrectly defined - log an error */
            G_tok->log_error(TCERR_MMINH_MISSING_SUPPORT_FUNC,
                             25, "_multiMethodCallInherited");
        }
        else
        {
            /* generate the call */
            mmci->gen_code_call(discard, argc + 1, varargs, named_args);
        }
    }
    else
    {
        /* 
         *   It's the inherited<types>(args) format.
         */

        /* 
         *   Get the base name for the function.  'func' is the decorated
         *   name for the containing function, which is of the form
         *   'Base*type1;type2...'.  The base name is the part up to the
         *   asterisk.  
         */
        const char *nm = func->getstr(), *p;
        size_t rem = func->getlen();
        for (p = nm ; rem != 0 && *p != '*' ; ++p, --rem) ;

        /* make a token for the base name */
        CTcToken btok;
        btok.set_text(nm, p - nm);
        
        /* build the decorated name for the target function */
        CTcToken dtok;
        typelist_->decorate_name(&dtok, &btok);

        /* look up the decorated name */
        CTcSymFunc *ifunc = (CTcSymFunc *)G_prs->get_global_symtab()->find(
            dtok.get_text(), dtok.get_text_len());

        /* if we found it, call it */
        if (ifunc != 0 && ifunc->get_type() == TC_SYM_FUNC)
        {
            /* generate the call */
            ifunc->gen_code_call(discard, argc, varargs, named_args);
        }
        else
        {
            /* function not found */
            G_tok->log_error(TCERR_MMINH_UNDEF_FUNC, (int)(p - nm), nm);
        }
    }
}